

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O0

void * CSocekt::ServerRecyConnectionThread(void *threadData)

{
  SourceFile file;
  bool bVar1;
  int iVar2;
  reference ppfVar3;
  iterator pConn;
  long in_RDI;
  MutexLockGuard lock_1;
  MutexLockGuard lock;
  lp_connection_t p_Conn;
  iterator posend;
  iterator pos;
  int err;
  time_t currtime;
  CSocekt *pSocketObj;
  ThreadItem *pThread;
  MutexLock *in_stack_ffffffffffffef58;
  Logger *in_stack_ffffffffffffef60;
  const_iterator in_stack_ffffffffffffef68;
  undefined4 in_stack_ffffffffffffef70;
  lp_connection_t in_stack_ffffffffffffef78;
  _List_const_iterator<flyd_connection_s_*> in_stack_ffffffffffffef80;
  Logger *in_stack_ffffffffffffef90;
  _List_const_iterator<flyd_connection_s_*> local_1058 [3];
  Logger local_1040;
  _List_node_base *local_58;
  _List_node_base *local_50;
  flyd_connection_s *local_40;
  _List_iterator<flyd_connection_s_*> local_38;
  _List_iterator<flyd_connection_s_*> local_30 [2];
  time_t local_20;
  long local_18;
  
  local_18 = *(long *)(in_RDI + 8);
  std::_List_iterator<flyd_connection_s_*>::_List_iterator(local_30);
  std::_List_iterator<flyd_connection_s_*>::_List_iterator(&local_38);
  while( true ) {
    usleep(200000);
    iVar2 = muduo::detail::AtomicIntegerT<int>::get((AtomicIntegerT<int> *)(local_18 + 0x128));
    if (0 < iVar2) break;
LAB_0013ee2f:
    if (g_stopEvent == 1) {
      iVar2 = muduo::detail::AtomicIntegerT<int>::get((AtomicIntegerT<int> *)(local_18 + 0x128));
      if (0 < iVar2) {
        muduo::MutexLockGuard::MutexLockGuard
                  ((MutexLockGuard *)in_stack_ffffffffffffef60,in_stack_ffffffffffffef58);
        while( true ) {
          local_30[0]._M_node =
               (_List_node_base *)
               std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::begin
                         ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                          in_stack_ffffffffffffef58);
          local_38._M_node =
               (_List_node_base *)
               std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::end
                         ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                          in_stack_ffffffffffffef58);
          bVar1 = std::operator!=(local_30,&local_38);
          if (!bVar1) break;
          ppfVar3 = std::_List_iterator<flyd_connection_s_*>::operator*
                              ((_List_iterator<flyd_connection_s_*> *)0x13eeec);
          local_40 = *ppfVar3;
          muduo::detail::AtomicIntegerT<int>::decrement((AtomicIntegerT<int> *)0x13ef0b);
          in_stack_ffffffffffffef58 = (MutexLock *)(local_18 + 0x110);
          std::_List_const_iterator<flyd_connection_s_*>::_List_const_iterator
                    ((_List_const_iterator<flyd_connection_s_*> *)&stack0xffffffffffffef80,local_30)
          ;
          pConn = std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::
                  erase((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                        in_stack_ffffffffffffef60,in_stack_ffffffffffffef68);
          flyd_free_connection
                    ((CSocekt *)in_stack_ffffffffffffef80._M_node,(lp_connection_t)pConn._M_node);
        }
        muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x13ef8a);
      }
      return (void *)0x0;
    }
  }
  local_20 = time((time_t *)0x0);
  muduo::MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)in_stack_ffffffffffffef60,in_stack_ffffffffffffef58);
  do {
    local_50 = (_List_node_base *)
               std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::begin
                         ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                          in_stack_ffffffffffffef58);
    local_30[0]._M_node = local_50;
    local_58 = (_List_node_base *)
               std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::end
                         ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                          in_stack_ffffffffffffef58);
    local_38._M_node = local_58;
    while( true ) {
      bVar1 = std::operator!=(local_30,&local_38);
      if (!bVar1) {
        muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x13ee1b);
        goto LAB_0013ee2f;
      }
      ppfVar3 = std::_List_iterator<flyd_connection_s_*>::operator*
                          ((_List_iterator<flyd_connection_s_*> *)0x13ec84);
      local_40 = *ppfVar3;
      if ((local_40->inRecyTime + (long)*(int *)(local_18 + 300) <= local_20) || (g_stopEvent != 0))
      break;
      std::_List_iterator<flyd_connection_s_*>::operator++(local_30);
    }
    iVar2 = muduo::detail::AtomicIntegerT<int>::get(&local_40->iThrowsendCount);
    if (0 < iVar2) {
      muduo::Logger::SourceFile::SourceFile<105>
                ((SourceFile *)CONCAT44(iVar2,in_stack_ffffffffffffef70),
                 (char (*) [105])in_stack_ffffffffffffef68._M_node);
      file.size_ = in_stack_ffffffffffffef70;
      file.data_ = (char *)in_stack_ffffffffffffef68._M_node;
      file._12_4_ = iVar2;
      muduo::Logger::Logger
                (in_stack_ffffffffffffef60,file,(int)((ulong)in_stack_ffffffffffffef58 >> 0x20),
                 (LogLevel)in_stack_ffffffffffffef58);
      in_stack_ffffffffffffef68._M_node = (_List_node_base *)muduo::Logger::stream(&local_1040);
      muduo::LogStream::operator<<
                ((LogStream *)CONCAT44(iVar2,in_stack_ffffffffffffef70),
                 (char *)in_stack_ffffffffffffef68._M_node);
      muduo::Logger::~Logger(in_stack_ffffffffffffef90);
    }
    muduo::detail::AtomicIntegerT<int>::decrement((AtomicIntegerT<int> *)0x13eda5);
    in_stack_ffffffffffffef60 = (Logger *)(local_18 + 0x110);
    std::_List_const_iterator<flyd_connection_s_*>::_List_const_iterator(local_1058,local_30);
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::erase
              ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
               in_stack_ffffffffffffef60,in_stack_ffffffffffffef68);
    flyd_free_connection((CSocekt *)in_stack_ffffffffffffef80._M_node,in_stack_ffffffffffffef78);
  } while( true );
}

Assistant:

void* CSocekt::ServerRecyConnectionThread(void* threadData)
{
    ThreadItem *pThread = static_cast<ThreadItem*>(threadData);
    CSocekt *pSocketObj = pThread->_pThis;
    
    time_t currtime;
    int err;
    std::list<lp_connection_t>::iterator pos,posend;
    lp_connection_t p_Conn;
    
    while(1)
    {
        //为简化问题，我们直接每次休息200毫秒
        usleep(200 * 1000);  //单位是微妙,又因为1毫秒=1000微妙，所以 200 *1000 = 200毫秒

        //不管啥情况，先把这个条件成立时该做的动作做了
        if(pSocketObj->m_total_recyconnection_n.get() > 0)
        {
            currtime = time(NULL);
            muduo::MutexLockGuard lock(pSocketObj->m_recyconnqueueMutex);  
        //    if(err != 0) ngx_log_stderr(err,"CSocekt::ServerRecyConnectionThread()中pthread_mutex_lock()失败，返回的错误码为%d!",err);

lblRRTD:
            pos    = pSocketObj->m_recyconnectionList.begin();
			posend = pSocketObj->m_recyconnectionList.end();
            for(; pos != posend; ++pos)
            {
                p_Conn = (*pos);
                if(
                    ( (p_Conn->inRecyTime + pSocketObj->m_RecyConnectionWaitTime) > currtime)  && (g_stopEvent == 0) //如果不是要整个系统退出，你可以continue，否则就得要强制释放
                    )
                {
                    continue; //没到释放的时间
                }    
                //到释放的时间了: 
                //......这将来可能还要做一些是否能释放的判断[在我们写完发送数据代码之后吧]，先预留位置
                //....

                //我认为，凡是到释放时间的，iThrowsendCount都应该为0；这里我们加点日志判断下
                if(p_Conn->iThrowsendCount.get() > 0)
                {
                    //这确实不应该，打印个日志吧；
                   // ngx_log_stderr(0,"CSocekt::ServerRecyConnectionThread()中到释放时间却发现p_Conn.iThrowsendCount!=0，这个不该发生");
                    //其他先暂时啥也不敢，路程继续往下走，继续去释放吧。
                    LOG_ERROR << "CSocekt::ServerRecyConnectionThread()中到释放时间却发现p_Conn.iThrowsendCount!=0，这个不该发生";
                }

                //流程走到这里，表示可以释放，那我们就开始释放
                pSocketObj->m_total_recyconnection_n.decrement();        //待释放连接队列大小-1
                pSocketObj->m_recyconnectionList.erase(pos);   //迭代器已经失效，但pos所指内容在p_Conn里保存着呢

                //ngx_log_stderr(0,"CSocekt::ServerRecyConnectionThread()执行，连接%d被归还.",p_Conn->fd);

                pSocketObj->flyd_free_connection(p_Conn);	   //归还参数pConn所代表的连接到到连接池中
                goto lblRRTD; 
            } //end for
          //  err = pthread_mutex_unlock(&pSocketObj->m_recyconnqueueMutex); 
         //   if(err != 0)  LOG_ERROR << "CSocekt::ServerRecyConnectionThread()pthread_mutex_unlock()失败，返回的错误码为!" << err;
        } //end if

        if(g_stopEvent == 1) //要退出整个程序，那么肯定要先退出这个循环
        {
            if(pSocketObj->m_total_recyconnection_n.get() > 0)
            {
                muduo::MutexLockGuard lock(pSocketObj->m_recyconnqueueMutex);
                //因为要退出，所以就得硬释放了【不管到没到时间，不管有没有其他不 允许释放的需求，都得硬释放】
               // err = pthread_mutex_lock(&pSocketObj->m_recyconnqueueMutex);  
               // if(err != 0) ngx_log_stderr(err,"CSocekt::ServerRecyConnectionThread()中pthread_mutex_lock2()失败，返回的错误码为%d!",err);

        lblRRTD2:
                pos    = pSocketObj->m_recyconnectionList.begin();
			    posend = pSocketObj->m_recyconnectionList.end();
                for(; pos != posend; ++pos)
                {
                    p_Conn = (*pos);
                    pSocketObj->m_total_recyconnection_n.decrement();        //待释放连接队列大小-1
                    pSocketObj->m_recyconnectionList.erase(pos);   //迭代器已经失效，但pos所指内容在p_Conn里保存着呢
                    pSocketObj->flyd_free_connection(p_Conn);	   //归还参数pConn所代表的连接到到连接池中
                    goto lblRRTD2; 
                } //end for
                //err = pthread_mutex_unlock(&pSocketObj->m_recyconnqueueMutex); 
               // if(err != 0)  ngx_log_stderr(err,"CSocekt::ServerRecyConnectionThread()pthread_mutex_unlock2()失败，返回的错误码为%d!",err);
            } //end if
            break; //整个程序要退出了，所以break;
        }  //end if
    } //end while    
    
    return (void*)0;
}